

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O0

ScopeID * __thiscall
mocker::SymTbl::createSubscope(ScopeID *__return_storage_ptr__,SymTbl *this,ScopeID *pntID)

{
  element_type *peVar1;
  size_type sVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  unsigned_long local_70;
  undefined1 local_68 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> id;
  shared_ptr<mocker::SymTbl::Scope> local_40;
  undefined1 local_30 [8];
  shared_ptr<mocker::SymTbl::Scope> pnt;
  ScopeID *pntID_local;
  SymTbl *this_local;
  
  pnt.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pntID;
  getScope((SymTbl *)local_30,(ScopeID *)this);
  peVar1 = std::__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  std::make_shared<mocker::SymTbl::Scope,std::shared_ptr<mocker::SymTbl::Scope>&>(&local_40);
  std::
  vector<std::shared_ptr<mocker::SymTbl::Scope>,std::allocator<std::shared_ptr<mocker::SymTbl::Scope>>>
  ::emplace_back<std::shared_ptr<mocker::SymTbl::Scope>>
            ((vector<std::shared_ptr<mocker::SymTbl::Scope>,std::allocator<std::shared_ptr<mocker::SymTbl::Scope>>>
              *)&peVar1->subscopes,&local_40);
  std::shared_ptr<mocker::SymTbl::Scope>::~shared_ptr(&local_40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             pnt.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  peVar1 = std::__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  sVar2 = std::
          vector<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
          ::size(&peVar1->subscopes);
  local_70 = sVar2 - 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,&local_70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_88,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  ScopeID::ScopeID(__return_storage_ptr__,&local_88);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_88);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  std::shared_ptr<mocker::SymTbl::Scope>::~shared_ptr((shared_ptr<mocker::SymTbl::Scope> *)local_30)
  ;
  return __return_storage_ptr__;
}

Assistant:

ScopeID SymTbl::createSubscope(const ScopeID &pntID) {
  auto pnt = getScope(pntID);
  pnt->subscopes.emplace_back(std::make_shared<Scope>(pnt));
  auto id = pntID.ids;
  id.emplace_back(pnt->subscopes.size() - 1);
  return ScopeID(std::move(id));
}